

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  float *pfVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ImGuiContext *ctx;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pIVar4 = GImGui;
  iVar8 = components + -1;
  pIVar2 = GImGui->CurrentWindow;
  fVar13 = (GImGui->Style).ItemInnerSpacing.x;
  fVar11 = (float)(int)((w_full - fVar13 * (float)iVar8) / (float)components);
  fVar12 = 1.0;
  if (1.0 <= fVar11) {
    fVar12 = fVar11;
  }
  fVar11 = (float)(int)(w_full - (fVar13 + fVar12) * (float)iVar8);
  fVar13 = 1.0;
  if (1.0 <= fVar11) {
    fVar13 = fVar11;
  }
  iVar5 = (pIVar2->DC).ItemWidthStack.Size;
  if (iVar5 == (pIVar2->DC).ItemWidthStack.Capacity) {
    if (iVar5 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar5 / 2 + iVar5;
    }
    iVar9 = iVar5 + 1;
    if (iVar5 + 1 < iVar7) {
      iVar9 = iVar7;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    pfVar6 = (float *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
    pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
    if (pfVar3 != (float *)0x0) {
      memcpy(pfVar6,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
      pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
      if ((pfVar3 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pfVar3,GImAllocatorUserData);
    }
    (pIVar2->DC).ItemWidthStack.Data = pfVar6;
    (pIVar2->DC).ItemWidthStack.Capacity = iVar9;
    iVar5 = (pIVar2->DC).ItemWidthStack.Size;
  }
  else {
    pfVar6 = (pIVar2->DC).ItemWidthStack.Data;
  }
  pfVar6[iVar5] = fVar13;
  uVar10 = (pIVar2->DC).ItemWidthStack.Size + 1;
  (pIVar2->DC).ItemWidthStack.Size = uVar10;
  if (1 < components) {
    do {
      if (uVar10 == (pIVar2->DC).ItemWidthStack.Capacity) {
        if (uVar10 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = (int)uVar10 / 2 + uVar10;
        }
        iVar7 = uVar10 + 1;
        if ((int)(uVar10 + 1) < iVar5) {
          iVar7 = iVar5;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pfVar6 = (float *)(*GImAllocatorAllocFunc)((long)iVar7 << 2,GImAllocatorUserData);
        pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
        if (pfVar3 != (float *)0x0) {
          memcpy(pfVar6,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
          pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
          if ((pfVar3 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pfVar3,GImAllocatorUserData);
        }
        (pIVar2->DC).ItemWidthStack.Data = pfVar6;
        (pIVar2->DC).ItemWidthStack.Capacity = iVar7;
        uVar10 = (pIVar2->DC).ItemWidthStack.Size;
      }
      else {
        pfVar6 = (pIVar2->DC).ItemWidthStack.Data;
      }
      pfVar6[(int)uVar10] = fVar12;
      uVar10 = (pIVar2->DC).ItemWidthStack.Size + 1;
      (pIVar2->DC).ItemWidthStack.Size = uVar10;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  if (0 < (int)uVar10) {
    (pIVar2->DC).ItemWidth = (pIVar2->DC).ItemWidthStack.Data[(ulong)uVar10 - 1];
    *(byte *)&(pIVar4->NextItemData).Flags = (byte)(pIVar4->NextItemData).Flags & 0xfe;
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                ,0x50d,"T &ImVector<float>::back() [T = float]");
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}